

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterUnix.h
# Opt level: O0

bool __thiscall
PixelToaster::UnixDisplay::update
          (UnixDisplay *this,TrueColorPixel *trueColorPixels,FloatingPointPixel *floatingPointPixels
          ,Rectangle *dirtyBox)

{
  Converter *pCVar1;
  int iVar2;
  int iVar3;
  Enumeration EVar4;
  char *pcVar5;
  bool bVar6;
  bool shortcut;
  int size;
  int h;
  int w;
  Rectangle *dirtyBox_local;
  FloatingPointPixel *floatingPointPixels_local;
  TrueColorPixel *trueColorPixels_local;
  UnixDisplay *this_local;
  
  if ((this->isShuttingDown_ & 1U) == 0) {
    if (((this->display_ == (Display *)0x0) || (this->window_ == 0)) ||
       (this->image_ == (XImage *)0x0)) {
      this_local._7_1_ = false;
    }
    else {
      iVar2 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[9])();
      iVar3 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[10])();
      bVar6 = false;
      if (trueColorPixels != (TrueColorPixel *)0x0) {
        EVar4 = Format::operator_cast_to_Enumeration(&this->destFormat_);
        bVar6 = EVar4 == XRGB8888;
      }
      if (bVar6) {
        this->image_->data = (char *)trueColorPixels;
      }
      else {
        if (trueColorPixels == (TrueColorPixel *)0x0) {
          if (floatingPointPixels == (FloatingPointPixel *)0x0) {
            return false;
          }
          pCVar1 = this->floatingPointConverter_;
          pcVar5 = DirtyVector<char>::get(&this->buffer_);
          (**(code **)(*(long *)pCVar1 + 0x18))(pCVar1,floatingPointPixels,pcVar5,iVar2 * iVar3);
        }
        else {
          pCVar1 = this->trueColorConverter_;
          pcVar5 = DirtyVector<char>::get(&this->buffer_);
          (**(code **)(*(long *)pCVar1 + 0x18))(pCVar1,trueColorPixels,pcVar5,iVar2 * iVar3);
        }
        pcVar5 = DirtyVector<char>::get(&this->buffer_);
        this->image_->data = pcVar5;
      }
      XPutImage(this->display_,this->window_,this->gc_,this->image_,0,0,0,0,iVar2,iVar3);
      XFlush(this->display_);
      this->image_->data = (char *)0x0;
      pumpEvents(this);
      this_local._7_1_ = true;
    }
  }
  else {
    (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[3])();
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool update(const TrueColorPixel* trueColorPixels, const FloatingPointPixel* floatingPointPixels, const Rectangle* dirtyBox) override
    {
        if (isShuttingDown_)
        {
            close();
            return false;
        }

        if (!display_ || !window_ || !image_)
            return false;

        const int w    = width();
        const int h    = height();
        const int size = w * h;

        const bool shortcut = trueColorPixels != nullptr && destFormat_ == Format::XRGB8888;

        if (!shortcut)
        {
            // extra conversion step: copy pixels to buffer

            if (trueColorPixels)
                trueColorConverter_->convert(trueColorPixels, buffer_.get(), size);
            else if (floatingPointPixels)
                floatingPointConverter_->convert(floatingPointPixels, buffer_.get(), size);
            else
                return false;

            image_->data = buffer_.get();
        }
        else
        {
            // shortcut: avoid extra copy - only works for truecolor pixels

            image_->data = (char*)trueColorPixels;
        }

        ::XPutImage(display_, window_, gc_, image_, 0, 0, 0, 0, w, h);
        ::XFlush(display_);

        image_->data = nullptr;

        pumpEvents();

        return true;
    }